

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_test.c
# Opt level: O2

void benchmark_wmutex_contended(testing t)

{
  pthread_rwlock_t *__rwlock;
  contended_state cs;
  contended_state local_b0;
  
  memset(&local_b0,0,0x98);
  __rwlock = &local_b0.rwmutex;
  pthread_rwlock_init((pthread_rwlock_t *)__rwlock,(pthread_rwlockattr_t *)0x0);
  contended_state_run_test
            (&local_b0,t,__rwlock,void_pthread_rwlock_wrlock,void_pthread_rwlock_unlock);
  pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
  return;
}

Assistant:

static void benchmark_wmutex_contended (testing t) {
	contended_state cs;
	memset ((void *) &cs, 0, sizeof (cs));
	pthread_rwlock_init (&cs.rwmutex, NULL);
	contended_state_run_test (&cs, t, &cs.rwmutex, &void_pthread_rwlock_wrlock,
				  &void_pthread_rwlock_unlock);
	pthread_rwlock_destroy (&cs.rwmutex);
}